

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtl_sv.c
# Opt level: O3

void dtl_sv_set_ptr(dtl_sv_t *self,void *p,apx_void_ptr_func_t *pDestructor)

{
  if (self != (dtl_sv_t *)0x0) {
    if ((self->u32Flags & 0xf0) == 0xb0) {
      dtl_dv_dec_ref((self->pAny->val).dv);
    }
    dtl_sv_set_type(self,DTL_SV_PTR);
    (self->pAny->val).ptr.p = p;
    (self->pAny->val).ptr.pDestructor = pDestructor;
  }
  return;
}

Assistant:

void dtl_sv_set_ptr(dtl_sv_t *self, void *p, void (*pDestructor)(void*)){
   if(self){
      if(dtl_sv_type(self)==DTL_SV_DV){
         dtl_dv_dec_ref(self->pAny->val.dv);
      }
      dtl_sv_set_type(self,DTL_SV_PTR);
      self->pAny->val.ptr.p = p;
      self->pAny->val.ptr.pDestructor = pDestructor;
   }
}